

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O0

void __thiscall
cmProjectCommand::TopLevelCMakeVarCondSet(cmProjectCommand *this,char *name,char *value)

{
  cmMakefile *pcVar1;
  char *pcVar2;
  bool local_d1;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *value_local;
  char *name_local;
  cmProjectCommand *this_local;
  
  pcVar1 = (this->super_cmCommand).Makefile;
  local_20 = value;
  value_local = name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,name,&local_41);
  pcVar2 = cmMakefile::GetDefinition(pcVar1,&local_40);
  local_d1 = true;
  if (pcVar2 != (char *)0x0) {
    local_d1 = cmMakefile::IsRootMakefile((this->super_cmCommand).Makefile);
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  pcVar2 = value_local;
  if (local_d1 != false) {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar2,&local_79);
    cmMakefile::AddDefinition(pcVar1,&local_78,local_20);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    pcVar2 = value_local;
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,pcVar2,&local_a1);
    cmMakefile::AddCacheDefinition(pcVar1,&local_a0,local_20,"Value Computed by CMake",STATIC,false)
    ;
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  return;
}

Assistant:

void cmProjectCommand::TopLevelCMakeVarCondSet(const char* const name,
                                               const char* const value)
{
  // Set the CMAKE_PROJECT_XXX variable to be the highest-level
  // project name in the tree. If there are two project commands
  // in the same CMakeLists.txt file, and it is the top level
  // CMakeLists.txt file, then go with the last one.
  if (!this->Makefile->GetDefinition(name) ||
      (this->Makefile->IsRootMakefile())) {
    this->Makefile->AddDefinition(name, value);
    this->Makefile->AddCacheDefinition(name, value, "Value Computed by CMake",
                                       cmStateEnums::STATIC);
  }
}